

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O0

LatencyItem * __thiscall MapWrapper::addItem(MapWrapper *this,string *bin_name)

{
  LatencyItem *pLVar1;
  LatencyItem *in_RDI;
  LatencyItem *item;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>
  *in_stack_ffffffffffffff88;
  
  pLVar1 = (LatencyItem *)operator_new(0x50);
  LatencyItem::LatencyItem(in_RDI,&in_stack_ffffffffffffff88->first);
  std::make_pair<std::__cxx11::string_const&,LatencyItem*&>
            (&in_stack_ffffffffffffff88->first,
             (LatencyItem **)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  std::
  unordered_map<std::__cxx11::string,LatencyItem*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,LatencyItem*>>>
  ::insert<std::pair<std::__cxx11::string,LatencyItem*>>
            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>_>_>
              *)in_RDI,in_stack_ffffffffffffff88);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LatencyItem_*>
           *)0x187e89);
  return pLVar1;
}

Assistant:

LatencyItem* addItem(const std::string& bin_name) {
        LatencyItem* item = new LatencyItem(bin_name);
        map.insert( std::make_pair(bin_name, item) );
        return item;
    }